

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL> *
split<4u>(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
          *__return_storage_ptr__,string *s,char sep)

{
  char *pcVar1;
  istream *piVar2;
  out_of_range *poVar3;
  invalid_argument *this;
  long lVar4;
  string tmp;
  istringstream iss;
  
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
  array(__return_storage_ptr__);
  if ((s->_M_string_length != 0) &&
     ((pcVar1 = (s->_M_dataplus)._M_p, *pcVar1 == sep || (pcVar1[s->_M_string_length - 1] == sep))))
  {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"strings starts or ends with separator");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)s,_S_in);
  lVar4 = 0;
  do {
    if (lVar4 + 0x20 == 0xa0) {
      tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
      tmp._M_string_length = 0;
      tmp.field_2._M_local_buf[0] = '\0';
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&iss,(string *)&tmp,sep);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
        std::__cxx11::string::~string((string *)&tmp);
        std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
        return __return_storage_ptr__;
      }
      poVar3 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar3,"n");
      __cxa_throw(poVar3,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&iss,
                        (string *)
                        ((long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar4),sep);
    lVar4 = lVar4 + 0x20;
  } while (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0);
  poVar3 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(poVar3,"n");
  __cxa_throw(poVar3,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

std::array<std::string, n> split(const std::string& s, const char sep)
{
  std::array<std::string, n> result;

  if (!s.empty())
  {
    if (s.front() == sep || s.back() == sep)
    {
      throw std::invalid_argument("strings starts or ends with separator");
    }
  }

  std::istringstream iss(s);
  for (uint32_t i = 0; i < n; ++i)
  {
    if (!std::getline(iss, result[i], sep))
    {
      throw std::out_of_range("n");
    }
  }

  std::string tmp;
  if (std::getline(iss, tmp, sep))
  {
    throw std::out_of_range("n");
  }

  return result;
}